

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

size_t doctest::detail::my_strlen(char *in)

{
  bool bVar1;
  char *local_18;
  char *temp;
  char *in_local;
  
  local_18 = in;
  while( true ) {
    bVar1 = false;
    if (local_18 != (char *)0x0) {
      bVar1 = *local_18 != '\0';
    }
    if (!bVar1) break;
    local_18 = local_18 + 1;
  }
  return (long)local_18 - (long)in;
}

Assistant:

size_t my_strlen(const char* in) {
        const char* temp = in;
        while(temp && *temp)
            ++temp;
        return temp - in;
    }